

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O3

void __thiscall SpriteBase::~SpriteBase(SpriteBase *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  (this->super_Sprite)._vptr_Sprite = (_func_int **)&PTR_get_data_00157900;
  if (this->data != (uint8_t *)0x0) {
    operator_delete__(this->data);
    this->data = (uint8_t *)0x0;
  }
  p_Var2 = (this->super_Sprite).super_enable_shared_from_this<Data::Sprite>._M_weak_this.
           super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

SpriteBase::~SpriteBase() {
  if (data != nullptr) {
    delete[] data;
    data = nullptr;
  }
}